

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_123::AsyncPipe::AbortedRead::write
          (AbortedRead *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  size_t sVar2;
  String local_1c8;
  Exception local_1a8;
  
  kj::_::Debug::makeDescription<char_const(&)[28]>
            (&local_1c8,(Debug *)0x50c726,"abortRead() has been called",(char (*) [28])__n);
  Exception::Exception
            (&local_1a8,DISCONNECTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x59e,&local_1c8);
  kj::_::PromiseDisposer::
  alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
            ((PromiseDisposer *)this,&local_1a8);
  Exception::~Exception(&local_1a8);
  sVar2 = local_1c8.content.size_;
  pcVar1 = local_1c8.content.ptr;
  if (local_1c8.content.ptr != (char *)0x0) {
    local_1c8.content.ptr = (char *)0x0;
    local_1c8.content.size_ = 0;
    (**(local_1c8.content.disposer)->_vptr_ArrayDisposer)
              (local_1c8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
      return KJ_EXCEPTION(DISCONNECTED, "abortRead() has been called");
    }